

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

bool_t memIsDisjoint4(void *buf1,size_t count1,void *buf2,size_t count2,void *buf3,size_t count3,
                     void *buf4,size_t count4)

{
  bool_t bVar1;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *in_R8;
  void *in_R9;
  uint7 in_stack_ffffffffffffffc8;
  bool bVar2;
  
  bVar1 = memIsDisjoint2(in_RDI,(size_t)in_RSI,in_RDX,(size_t)in_RCX);
  bVar2 = false;
  if (bVar1 != 0) {
    bVar1 = memIsDisjoint2(in_RDI,(size_t)in_RSI,in_R8,(size_t)in_R9);
    bVar2 = false;
    if (bVar1 != 0) {
      bVar1 = memIsDisjoint2(in_RDI,(size_t)in_RSI,(void *)count3,(size_t)buf3);
      bVar2 = false;
      if (bVar1 != 0) {
        bVar1 = memIsDisjoint3(in_RSI,(size_t)in_RDX,in_RCX,(size_t)in_R8,in_R9,
                               (ulong)in_stack_ffffffffffffffc8);
        bVar2 = bVar1 != 0;
      }
    }
  }
  return (bool_t)bVar2;
}

Assistant:

bool_t memIsDisjoint4(const void* buf1, size_t count1,
	const void* buf2, size_t count2,
	const void* buf3, size_t count3,
	const void* buf4, size_t count4)
{
	return memIsDisjoint2(buf1, count1, buf2, count2) &&
		memIsDisjoint2(buf1, count1, buf3, count3) &&
		memIsDisjoint2(buf1, count1, buf4, count4) &&
		memIsDisjoint3(buf2, count2, buf3, count3, buf4, count4);
}